

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_inet_types.c
# Opt level: O0

int ipv6_prefix_store_clb
              (ly_ctx *ctx,char *UNUSED_type_name,char **value_str,lyd_val *value,char **err_msg)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  uint32_t local_7c;
  uint local_78;
  uint32_t mask;
  anon_union_16_2_94730013 addr_bin;
  unsigned_long j;
  unsigned_long i;
  unsigned_long pref;
  char *result;
  char *ptr;
  char *pref_str;
  char **err_msg_local;
  lyd_val *value_local;
  char **value_str_local;
  char *UNUSED_type_name_local;
  ly_ctx *ctx_local;
  
  pref_str = (char *)err_msg;
  err_msg_local = (char **)value;
  value_local = (lyd_val *)value_str;
  value_str_local = (char **)UNUSED_type_name;
  UNUSED_type_name_local = (char *)ctx;
  ptr = strchr(*value_str,0x2f);
  if (ptr == (char *)0x0) {
    iVar1 = asprintf((char **)pref_str,"Invalid IPv6 prefix \"%s\".",value_local->binary);
    if (iVar1 == -1) {
      pref_str[0] = '\0';
      pref_str[1] = '\0';
      pref_str[2] = '\0';
      pref_str[3] = '\0';
      pref_str[4] = '\0';
      pref_str[5] = '\0';
      pref_str[6] = '\0';
      pref_str[7] = '\0';
    }
    ctx_local._4_4_ = 1;
  }
  else {
    i = strtoul(ptr + 1,&result,10);
    if ((*result == '\0') && (i < 0x81)) {
      pref = (unsigned_long)malloc(0x32);
      if ((char *)pref == (char *)0x0) {
        pref_str[0] = '\0';
        pref_str[1] = '\0';
        pref_str[2] = '\0';
        pref_str[3] = '\0';
        pref_str[4] = '\0';
        pref_str[5] = '\0';
        pref_str[6] = '\0';
        pref_str[7] = '\0';
        ctx_local._4_4_ = 1;
      }
      else {
        strncpy((char *)pref,value_local->binary,(long)ptr - value_local->dec64);
        ptr[pref - value_local->dec64] = '\0';
        iVar1 = inet_pton(10,(char *)pref,&local_78);
        if (iVar1 == 1) {
          for (j = 0; j < 4; j = j + 1) {
            local_7c = 0;
            for (addr_bin._8_8_ = 0; (ulong)addr_bin._8_8_ < 0x20;
                addr_bin._8_8_ = addr_bin._8_8_ + 1) {
              local_7c = local_7c << 1;
              if (j * 0x20 + addr_bin._8_8_ < i) {
                local_7c = local_7c | 1;
              }
            }
            uVar2 = htonl(local_7c);
            (&local_78)[j] = uVar2 & (&local_78)[j];
          }
          pcVar3 = inet_ntop(10,&local_78,(char *)pref,0x2e);
          pcVar5 = pref_str;
          if (pcVar3 == (char *)0x0) {
            piVar4 = __errno_location();
            pcVar3 = strerror(*piVar4);
            iVar1 = asprintf((char **)pcVar5,"Failed to convert IPv6 address (%s).",pcVar3);
            if (iVar1 == -1) {
              pref_str[0] = '\0';
              pref_str[1] = '\0';
              pref_str[2] = '\0';
              pref_str[3] = '\0';
              pref_str[4] = '\0';
              pref_str[5] = '\0';
              pref_str[6] = '\0';
              pref_str[7] = '\0';
            }
            free((void *)pref);
            ctx_local._4_4_ = 1;
          }
          else {
            strcat((char *)pref,ptr);
            iVar1 = strcmp((char *)pref,value_local->binary);
            if (iVar1 == 0) {
              free((void *)pref);
            }
            else {
              lydict_remove(UNUSED_type_name_local,value_local->binary);
              pcVar5 = (char *)lydict_insert_zc(UNUSED_type_name_local,pref);
              value_local->binary = pcVar5;
              *err_msg_local = (char *)*value_local;
            }
            ctx_local._4_4_ = 0;
          }
        }
        else {
          iVar1 = asprintf((char **)pref_str,"Failed to convert IPv6 address \"%s\".",pref);
          if (iVar1 == -1) {
            pref_str[0] = '\0';
            pref_str[1] = '\0';
            pref_str[2] = '\0';
            pref_str[3] = '\0';
            pref_str[4] = '\0';
            pref_str[5] = '\0';
            pref_str[6] = '\0';
            pref_str[7] = '\0';
          }
          free((void *)pref);
          ctx_local._4_4_ = 1;
        }
      }
    }
    else {
      iVar1 = asprintf((char **)pref_str,"Invalid IPv6 prefix \"%s\".",value_local->binary);
      if (iVar1 == -1) {
        pref_str[0] = '\0';
        pref_str[1] = '\0';
        pref_str[2] = '\0';
        pref_str[3] = '\0';
        pref_str[4] = '\0';
        pref_str[5] = '\0';
        pref_str[6] = '\0';
        pref_str[7] = '\0';
      }
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
ipv6_prefix_store_clb(struct ly_ctx *ctx, const char *UNUSED(type_name), const char **value_str, lyd_val *value, char **err_msg)
{
    char *pref_str, *ptr, *result;
    unsigned long int pref, i, j;
    union {
        struct in6_addr s;
        uint32_t a[4];
    } addr_bin;
    uint32_t mask;

    pref_str = strchr(*value_str, '/');
    if (!pref_str) {
        if (asprintf(err_msg, "Invalid IPv6 prefix \"%s\".", *value_str) == -1) {
            *err_msg = NULL;
        }
        return 1;
    }

    /* learn prefix */
    pref = strtoul(pref_str + 1, &ptr, 10);
    if (ptr[0] || (pref > 128)) {
        if (asprintf(err_msg, "Invalid IPv6 prefix \"%s\".", *value_str) == -1) {
            *err_msg = NULL;
        }
        return 1;
    }

    result = malloc(INET6_ADDRSTRLEN + 4);
    if (!result) {
        *err_msg = NULL;
        return 1;
    }

    /* copy just the network prefix */
    strncpy(result, *value_str, pref_str - *value_str);
    result[pref_str - *value_str] = '\0';

    /* convert it to binary form */
    if (inet_pton(AF_INET6, result, (void *)&addr_bin.s) != 1) {
        if (asprintf(err_msg, "Failed to convert IPv6 address \"%s\".", result) == -1) {
            *err_msg = NULL;
        }
        free(result);
        return 1;
    }

    /* zero host bits */
    for (i = 0; i < 4; ++i) {
        mask = 0;
        for (j = 0; j < 32; ++j) {
            mask <<= 1;
            if (pref > (i * 32) + j) {
                mask |= 1;
            }
        }
        mask = htonl(mask);
        addr_bin.a[i] &= mask;
    }

    /* convert back to string */
    if (!inet_ntop(AF_INET6, (void *)&addr_bin.s, result, INET6_ADDRSTRLEN)) {
        if (asprintf(err_msg, "Failed to convert IPv6 address (%s).", strerror(errno)) == -1) {
            *err_msg = NULL;
        }
        free(result);
        return 1;
    }

    /* add the prefix */
    strcat(result, pref_str);

    if (strcmp(result, *value_str)) {
        /* some conversion took place, update the value */
        lydict_remove(ctx, *value_str);
        *value_str = lydict_insert_zc(ctx, result);
        value->string = *value_str;
    } else {
        free(result);
    }

    return 0;
}